

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::detail::ClassSpecializationKey::ClassSpecializationKey
          (ClassSpecializationKey *this,
          span<const_slang::ConstantValue_*const,_18446744073709551615UL> paramValues,
          span<const_slang::ast::Type_*const,_18446744073709551615UL> typeParams)

{
  ConstantValue *this_00;
  Type *this_01;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  __extent_storage<18446744073709551615UL> _Var4;
  long lVar5;
  ulong uVar6;
  __extent_storage<18446744073709551615UL> _Var7;
  
  _Var7 = typeParams._M_extent._M_extent_value;
  _Var4 = paramValues._M_extent._M_extent_value;
  (this->paramValues)._M_ptr = paramValues._M_ptr;
  (this->paramValues)._M_extent._M_extent_value = _Var4._M_extent_value;
  (this->typeParams)._M_ptr = typeParams._M_ptr;
  (this->typeParams)._M_extent._M_extent_value = _Var7._M_extent_value;
  if (_Var4._M_extent_value == 0) {
    uVar6 = 0;
  }
  else {
    lVar5 = 0;
    uVar6 = 0;
    do {
      this_00 = *(ConstantValue **)((long)paramValues._M_ptr + lVar5);
      if (this_00 == (ConstantValue *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = ConstantValue::hash(this_00);
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar3;
      uVar6 = uVar6 * 0x40 + 0x9e3779b9 + (uVar6 >> 2) +
              (SUB168(auVar1 * ZEXT816(0x9e3779b97f4a7c15),8) ^
              SUB168(auVar1 * ZEXT816(0x9e3779b97f4a7c15),0)) ^ uVar6;
      lVar5 = lVar5 + 8;
    } while (_Var4._M_extent_value << 3 != lVar5);
  }
  if (_Var7._M_extent_value != 0) {
    lVar5 = 0;
    do {
      this_01 = *(Type **)((long)typeParams._M_ptr + lVar5);
      if (this_01 == (Type *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = Type::hash(this_01);
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar3;
      uVar6 = uVar6 * 0x40 + 0x9e3779b9 + (uVar6 >> 2) +
              (SUB168(auVar2 * ZEXT816(0x9e3779b97f4a7c15),8) ^
              SUB168(auVar2 * ZEXT816(0x9e3779b97f4a7c15),0)) ^ uVar6;
      lVar5 = lVar5 + 8;
    } while (_Var7._M_extent_value << 3 != lVar5);
  }
  this->savedHash = uVar6;
  return;
}

Assistant:

ClassSpecializationKey::ClassSpecializationKey(std::span<const ConstantValue* const> paramValues,
                                               std::span<const Type* const> typeParams) :
    paramValues(paramValues), typeParams(typeParams) {

    // Precompute the hash.
    size_t h = 0;
    for (auto val : paramValues)
        hash_combine(h, val ? val->hash() : 0);
    for (auto type : typeParams)
        hash_combine(h, type ? type->hash() : 0);
    savedHash = h;
}